

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataFilter.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MinefieldDataFilter *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  MinefieldDataFilter *local_18;
  MinefieldDataFilter *this_local;
  
  local_18 = this;
  this_local = (MinefieldDataFilter *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Minefield Data Filter:");
  poVar1 = std::operator<<(poVar1,"\n\tGround Offset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter & 1);
  poVar1 = std::operator<<(poVar1,"\n\tWater Offset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tSnow Offset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMine Orientation: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 3 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tThermal Contrast: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 4 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tReflectance: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 5 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMine Emplacement Age: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 6 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tTrip / Detonation Wire: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 7 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFusing: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 8 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tScalar Detection Coefficient: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 9 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FilterUnion).m_ui32Filter >> 10 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MinefieldDataFilter::GetAsString() const
{
    KStringStream ss;

    ss << "Minefield Data Filter:"
       << "\n\tGround Offset: "                 << m_FilterUnion.m_ui32GroundOffset
       << "\n\tWater Offset: "                  << m_FilterUnion.m_ui32WaterOffset
       << "\n\tSnow Offset: "                   << m_FilterUnion.m_ui32SnowOffset
       << "\n\tMine Orientation: "              << m_FilterUnion.m_ui32MineOri
       << "\n\tThermal Contrast: "              << m_FilterUnion.m_ui32ThermalCon
       << "\n\tReflectance: "                   << m_FilterUnion.m_ui32Reflectance
       << "\n\tMine Emplacement Age: "          << m_FilterUnion.m_ui32MineEmpAge
       << "\n\tTrip / Detonation Wire: "        << m_FilterUnion.m_ui32TripDetWire
       << "\n\tFusing: "                        << m_FilterUnion.m_ui32Fusing
       << "\n\tScalar Detection Coefficient: "  << m_FilterUnion.m_ui32ScalarDet
       << "\n\tPaint Scheme: "                  << m_FilterUnion.m_ui32PaintScm
       << "\n";

    return ss.str();
}